

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCArray NULLC::DoubleToStr(int precision,bool exponent,double *r)

{
  char *src;
  size_t sVar1;
  NULLCArray NVar2;
  char buf [256];
  
  if (r == (double *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    NVar2 = (NULLCArray)ZEXT812(0);
  }
  else {
    src = "%.*f";
    if (exponent) {
      src = "%.*e";
    }
    SafeSprintf(buf,0x100,src,*r,precision);
    sVar1 = strlen(buf);
    NVar2 = AllocArray(1,(int)sVar1 + 1,2);
    memcpy(NVar2.ptr,buf,(ulong)NVar2.len);
  }
  return NVar2;
}

Assistant:

NULLCArray NULLC::DoubleToStr(int precision, bool exponent, double* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	char buf[256];
	SafeSprintf(buf, 256, exponent ? "%.*e" : "%.*f", precision, *r);
	arr = AllocArray(1, (int)strlen(buf) + 1, NULLC_TYPE_CHAR);
	memcpy(arr.ptr, buf, arr.len);
	return arr;
}